

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O3

void __thiscall Refal2::CRuleParser::direction(CRuleParser *this)

{
  string *str1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TTokenType TVar2;
  bool bVar3;
  string local_40;
  
  TVar2 = (this->super_CQualifierParser).token.type;
  if (TVar2 == TT_Blank) {
    return;
  }
  this->state = (TState)afterDirection;
  *(undefined8 *)&this->field_0x1e80 = 0;
  if (TVar2 == TT_Word) {
    paVar1 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"r","");
    str1 = &(this->super_CQualifierParser).token.word;
    bVar3 = CompareNoCase(str1,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (bVar3) {
      CFunctionBuilder::SetRightDirection((CFunctionBuilder *)this);
      return;
    }
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"l","");
    bVar3 = CompareNoCase(str1,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (bVar3) {
      return;
    }
  }
  AddToken(this);
  return;
}

Assistant:

void CRuleParser::direction()
{
	if( token.type == TT_Blank ) {
		return;
	}
	state = &CRuleParser::afterDirection;
	if( token.type == TT_Word ) {
		if( CompareNoCase( token.word, RuleRightMatchingDirectionTag ) ) {
			CFunctionBuilder::SetRightDirection();
			return;
		} else if( CompareNoCase( token.word, RuleLeftMatchingDirectionTag ) ) {
			return;
		}
	}
	AddToken();
}